

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

bool __thiscall
QAbstractEventDispatcher::filterNativeEvent
          (QAbstractEventDispatcher *this,QByteArray *eventType,void *message,qintptr *result)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  char cVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  lVar1 = *(long *)(this + 8);
  if (*(long *)(lVar1 + 0x88) == 0) {
    bVar5 = false;
  }
  else {
    lVar2 = *(long *)(lVar1 + 0x58);
    iVar7 = *(int *)(lVar2 + 0x88);
    *(int *)(lVar2 + 0x88) = iVar7 + 1;
    uVar6 = *(ulong *)(lVar1 + 0x88);
    if (uVar6 == 0) {
      bVar5 = false;
    }
    else {
      uVar8 = 0;
      do {
        plVar3 = *(long **)(*(long *)(lVar1 + 0x80) + uVar8 * 8);
        if (plVar3 != (long *)0x0) {
          cVar4 = (**(code **)(*plVar3 + 0x10))(plVar3,eventType,message,result);
          if (cVar4 != '\0') {
            bVar5 = true;
            goto LAB_0026e493;
          }
          uVar6 = *(ulong *)(lVar1 + 0x88);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar6);
      bVar5 = false;
LAB_0026e493:
      iVar7 = *(int *)(lVar2 + 0x88) + -1;
    }
    *(int *)(lVar2 + 0x88) = iVar7;
  }
  return bVar5;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }